

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

void __thiscall
Times<1,_1,_0>::Times(Times<1,_1,_0> *this,IntView<1> _x,IntView<1> _y,IntView<0> _z)

{
  IntVar *pIVar1;
  Times<1,_1,_0> *local_38;
  
  pIVar1 = _x.var;
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020fe18;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_38 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_38);
  local_38 = (Times<1,_1,_0> *)&this->super_Checker;
  (this->super_Checker)._vptr_Checker = (_func_int **)&PTR___cxa_pure_virtual_002102d0;
  vec<Checker_*>::push(&engine.checkers,(Checker **)&local_38);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_00212850;
  (this->super_Checker)._vptr_Checker = (_func_int **)&DAT_002128b8;
  (this->x).var = pIVar1;
  (this->x).a = (int)_x._8_8_;
  (this->x).b = (int)((ulong)_x._8_8_ >> 0x20);
  (this->y).var = _y.var;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  *(undefined4 *)&(this->z).var = _z.var._0_4_;
  *(undefined4 *)((long)&(this->z).var + 4) = _z.var._4_4_;
  (this->z).a = _z.a;
  (this->z).b = _z.b;
  (this->super_Propagator).priority = 1;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,0,6);
  pIVar1 = (this->y).var;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,1,6);
  pIVar1 = (this->z).var;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,2,6);
  return;
}

Assistant:

Times(IntView<U> _x, IntView<V> _y, IntView<W> _z) : x(_x), y(_y), z(_z) {
		priority = 1;
		assert(x.getMin() >= 0 && y.getMin() >= 0 && z.getMin() >= 0);
		x.attach(this, 0, EVENT_LU);
		y.attach(this, 1, EVENT_LU);
		z.attach(this, 2, EVENT_LU);
	}